

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void libdef_name(char *p,int kind)

{
  uint8_t *__dest;
  size_t sVar1;
  uint8_t *puVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  FILE *__stream;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  byte bVar14;
  byte bVar15;
  dasm_State *pdVar16;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint uVar17;
  dasm_State *__s;
  int *__s_00;
  uint uVar18;
  dasm_State *pdVar19;
  char *pcVar20;
  char *pcVar21;
  BuildCtx *ctx;
  uint *puVar22;
  BuildCtx *pBVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  uint32_t uVar27;
  uint8_t *puVar28;
  ulong uVar29;
  bool bVar30;
  int iStack_8160;
  short sStack_815c;
  char cStack_815a;
  char cStack_8159;
  undefined1 auStack_8158 [248];
  char *apcStack_8060 [4097];
  BuildCtx *pBStack_58;
  
  __s_00 = (int *)(ulong)(uint)kind;
  ctx = (BuildCtx *)p;
  iVar8 = kind;
  sVar9 = strlen(p);
  sVar1 = modnamelen;
  if (((kind != 0xc0) && (modnamelen < sVar9)) && (p[modnamelen] == '_')) {
    iVar8 = 0x1191f0;
    ctx = (BuildCtx *)p;
    iVar3 = strncmp(p,modname,modnamelen);
    if (iVar3 == 0) {
      p = p + sVar1 + 1;
      sVar9 = sVar9 - (sVar1 + 1);
    }
  }
  if (sVar9 < 0x3a) {
    if (optr + sVar9 + 3 < (uint8_t *)((long)&optr + 1U)) {
      __dest = optr + 1;
      puVar28 = optr + sVar9 + 1;
      puVar2 = __dest;
      *optr = (byte)kind | (byte)sVar9;
      optr = puVar2;
      memcpy(__dest,p,sVar9);
      optr = puVar28;
      return;
    }
  }
  else {
    ctx = (BuildCtx *)p;
    libdef_name_cold_2();
  }
  libdef_name_cold_1();
  pBVar23 = (BuildCtx *)*ctx->args;
  pBStack_58 = (BuildCtx *)p;
  if (pBVar23 == (BuildCtx *)0x0) {
LAB_0010b13f:
    emit_fold_cold_6();
  }
  else {
    if ((*(char *)&pBVar23->D == '-') &&
       (__stream = _stdin, *(char *)((long)&pBVar23->D + 1) == '\0')) {
LAB_0010adec:
      fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx->fp);
      fwrite("static const FoldFunc fold_func[] = {\n",0x26,1,(FILE *)ctx->fp);
      lineno = 0;
      funcidx = 0;
      nkeys = 0;
      pcVar10 = fgets((char *)&iStack_8160,0x100,__stream);
      pcVar11 = (char *)ctx;
      if (pcVar10 != (char *)0x0) {
        __s_00 = &iStack_8160;
        do {
          lineno = lineno + 1;
          if (sStack_815c == 0x444c && iStack_8160 == 0x4f464a4c) {
            pcVar11 = strchr(&cStack_815a,0x29);
            if (pcVar11 == (char *)0x0 || cStack_815a != '(') {
              if (((cStack_815a != 'X') && (cStack_815a != 'F')) ||
                 ((cStack_8159 != '(' || (pcVar11 == (char *)0x0)))) {
LAB_0010b128:
                iVar8 = (int)&cStack_815a;
                emit_fold_cold_2();
                goto LAB_0010b13a;
              }
              *pcVar11 = '\0';
              if (funcidx != 0) {
                fwrite(",\n",2,1,(FILE *)ctx->fp);
              }
              pcVar11 = "  fold_%s";
              if (cStack_815a == 'X') {
                pcVar11 = "  %s";
              }
              fprintf((FILE *)ctx->fp,pcVar11,auStack_8158);
              funcidx = funcidx + 1;
              pBVar23 = ctx;
            }
            else {
              *pcVar11 = '\0';
              apcStack_8060[0] = &cStack_8159;
              uVar4 = nexttoken(apcStack_8060,0,0);
              pBVar23 = (BuildCtx *)(ulong)uVar4;
              uVar5 = nexttoken(apcStack_8060,0,0x7f);
              iVar8 = 1;
              uVar6 = nexttoken(apcStack_8060,1,0x3ff);
              uVar27 = nkeys;
              iVar3 = funcidx;
              uVar12 = (ulong)nkeys;
              if (0xfff < uVar12) {
LAB_0010b13a:
                emit_fold_cold_4();
                goto LAB_0010b13f;
              }
              pBVar23 = (BuildCtx *)(ulong)(uVar4 << 0x11);
              uVar26 = uVar5 << 10 | uVar4 << 0x11 | uVar6;
              uVar7 = nkeys;
              if (nkeys != 0) {
                uVar18 = uVar26 & 0xffffff;
                puVar22 = foldkeys + uVar12;
                do {
                  uVar7 = (uint)uVar12;
                  uVar24 = foldkeys[uVar7 - 1] & 0xffffff;
                  if (uVar24 < uVar18) goto LAB_0010af7b;
                  if (uVar24 == uVar18) {
                    emit_fold_cold_3();
                    goto LAB_0010b128;
                  }
                  *puVar22 = foldkeys[uVar7 - 1];
                  puVar22 = puVar22 + -1;
                  uVar12 = uVar12 - 1;
                } while ((ulong)(uVar7 - 1) != 0);
                uVar7 = 0;
              }
LAB_0010af7b:
              foldkeys[uVar7] = uVar26 | iVar3 << 0x18;
              nkeys = uVar27 + 1;
            }
          }
          pcVar10 = fgets((char *)__s_00,0x100,__stream);
          pcVar11 = (char *)foldkeys;
        } while (pcVar10 != (char *)0x0);
      }
      fclose(__stream);
      fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
      uVar27 = nkeys;
      if (nkeys < 0x2000) {
        pcVar11 = "#define fold_hashkey(k)\t(lj_rol(lj_rol((k),%u)-(k),%u)%%%u)\n\n";
        uVar7 = nkeys | 1;
        do {
          __s_00 = (int *)0x0;
          do {
            iVar8 = tryhash((uint32_t *)apcStack_8060,uVar7,(uint32_t)__s_00,0);
            pBVar23 = (BuildCtx *)"#define fold_hashkey(k)\t(((((k)<<%u)-(k))<<%u)%%%u)\n\n";
            uVar27 = uVar7;
            if (iVar8 != 0) goto LAB_0010b0cf;
            uVar26 = (uint32_t)__s_00 + 1;
            __s_00 = (int *)(ulong)uVar26;
          } while (uVar26 != 0x400);
          __s_00 = (int *)0x0;
          do {
            iVar8 = tryhash((uint32_t *)apcStack_8060,uVar7,(uint32_t)__s_00,1);
            pBVar23 = (BuildCtx *)pcVar11;
            if (iVar8 != 0) goto LAB_0010b0cf;
            uVar26 = (uint32_t)__s_00 + 1;
            __s_00 = (int *)(ulong)uVar26;
          } while (uVar26 != 0x400);
          uVar27 = uVar7 + 2;
          bVar30 = uVar7 < 0x1ffe;
          uVar7 = uVar27;
        } while (bVar30);
      }
      emit_fold_cold_5();
      pBVar23 = (BuildCtx *)pcVar11;
LAB_0010b0cf:
      printhash(ctx,(uint32_t *)apcStack_8060,uVar27);
      fprintf((FILE *)ctx->fp,(char *)pBVar23,(ulong)__s_00 >> 5 & 0x7ffffff,
              (ulong)((uint)__s_00 & 0x1f),(ulong)uVar27);
      return;
    }
    iVar8 = 0x110bed;
    __stream = fopen64((char *)pBVar23,"r");
    if (__stream != (FILE *)0x0) goto LAB_0010adec;
  }
  emit_fold_cold_1();
  __s = pBVar23->D;
  if (__s != (dasm_State *)0x0) {
    pcVar11 = strchr((char *)__s,0x20);
    if (pcVar11 == (char *)0x0) {
      pdVar16 = (dasm_State *)0x0;
    }
    else {
      pdVar16 = (dasm_State *)(pcVar11 + 1);
      *pcVar11 = '\0';
    }
    pBVar23->D = pdVar16;
    if (iVar8 != 0) {
      iVar8 = strncmp((char *)__s,"IRFPM_",6);
      if (iVar8 == 0) {
        pcVar10 = "FLOOR";
        pcVar11 = (char *)((long)&__s->psize + 6);
        uVar12 = 0;
        do {
          pcVar20 = pcVar11;
          iVar3 = strcmp(pcVar10,pcVar11);
          uVar7 = (uint)pcVar20;
          iVar8 = (int)pdVar16;
          if (iVar3 == 0) {
            return;
          }
          uVar12 = (ulong)((int)uVar12 + 1);
          pcVar10 = irfpm_names[uVar12];
        } while (pcVar10 != (char *)0x0);
        goto LAB_0010b42c;
      }
      iVar8 = strncmp((char *)__s,"IRFL_",5);
      if (iVar8 == 0) {
        pcVar10 = "STR_LEN";
        pcVar11 = (char *)((long)&__s->psize + 5);
        uVar12 = 0;
        do {
          pcVar20 = pcVar11;
          iVar3 = strcmp(pcVar10,pcVar11);
          uVar7 = (uint)pcVar20;
          iVar8 = (int)pdVar16;
          if (iVar3 == 0) {
            return;
          }
          uVar12 = (ulong)((int)uVar12 + 1);
          pcVar10 = irfield_names[uVar12];
        } while (pcVar10 != (char *)0x0);
        goto LAB_0010b42c;
      }
      iVar8 = strncmp((char *)__s,"IRCALL_",7);
      if (iVar8 == 0) {
        pcVar10 = "lj_str_cmp";
        pcVar11 = (char *)((long)&__s->psize + 7);
        uVar12 = 0;
        do {
          pcVar20 = pcVar11;
          iVar3 = strcmp(pcVar10,pcVar11);
          uVar7 = (uint)pcVar20;
          iVar8 = (int)pdVar16;
          if (iVar3 == 0) {
            return;
          }
          uVar12 = (ulong)((int)uVar12 + 1);
          pcVar10 = ircall_names[uVar12];
        } while (pcVar10 != (char *)0x0);
        goto LAB_0010b42c;
      }
      uVar7 = 0x1125d0;
      iVar8 = strncmp((char *)__s,"IRCONV_",7);
      if (iVar8 == 0) {
        pcVar20 = "NIL";
        pcVar11 = (char *)((long)&__s->psize + 7);
        pcVar21 = (char *)0x5f;
        pcVar13 = strchr(pcVar11,0x5f);
        pcVar10 = pcVar13 + 1;
        uVar12 = 0;
        sVar9 = (long)pcVar13 - (long)pcVar11;
        do {
          bVar30 = true;
          if ((pcVar13 != (char *)0x0) &&
             (pcVar21 = pcVar11, iVar8 = strncmp(pcVar20,pcVar11,(long)pcVar13 - (long)pcVar11),
             iVar8 == 0)) {
            bVar30 = false;
            pcVar21 = pcVar10;
            iVar8 = strcmp("NIL",pcVar10);
            uVar29 = 0;
            while (iVar8 != 0) {
              uVar29 = (ulong)((int)uVar29 + 1);
              bVar30 = irt_names[uVar29] == (char *)0x0;
              if (bVar30) break;
              pcVar21 = pcVar10;
              iVar8 = strcmp(irt_names[uVar29],pcVar10);
            }
          }
          uVar7 = (uint)pcVar21;
          iVar8 = (int)sVar9;
          if (!bVar30) {
            return;
          }
          uVar12 = (ulong)((int)uVar12 + 1);
          pcVar20 = irt_names[uVar12];
        } while (pcVar20 != (char *)0x0);
        goto LAB_0010b42c;
      }
      if ((byte)((char)__s->psize - 0x30U) < 10) {
        uVar26 = CONCAT31((int3)((uint)iVar8 >> 8),(char)__s->psize);
        iVar8 = uVar26 - 0x30;
        bVar14 = (byte)iVar8;
        while (bVar14 < 10) {
          bVar14 = *(byte *)((long)&__s->psize + 1);
          uVar26 = (uint)bVar14;
          __s = (dasm_State *)((long)&__s->psize + 1);
          iVar8 = bVar14 - 0x30;
          bVar14 = (byte)iVar8;
        }
        if ((char)uVar26 == '\0') {
          return;
        }
        goto LAB_0010b42c;
      }
    }
    if ((extraout_EDX == 0) || (iVar8 = strcmp("any",(char *)__s), iVar8 != 0)) {
      pcVar11 = "LT";
      uVar12 = 0;
      do {
        pdVar19 = __s;
        iVar3 = strcmp(pcVar11,(char *)__s);
        uVar7 = (uint)pdVar19;
        iVar8 = (int)pdVar16;
        if (iVar3 == 0) {
          return;
        }
        uVar12 = (ulong)((int)uVar12 + 1);
        pcVar11 = ir_names[uVar12];
      } while (pcVar11 != (char *)0x0);
LAB_0010b42c:
      nexttoken_cold_1();
      if ((iVar8 == 0) || (0x1f < extraout_EDX_00 && (extraout_EDX_00 & 0x1f) != 0)) {
        memset(__s,0xff,(ulong)uVar7 * 4 + 4);
        uVar12 = (ulong)nkeys;
        if (uVar12 != 0) {
          bVar14 = (byte)extraout_EDX_00;
          lVar25 = 0;
          do {
            uVar26 = *(uint *)((long)foldkeys + lVar25);
            uVar18 = uVar26 & 0xffffff;
            bVar15 = (byte)(extraout_EDX_00 >> 5);
            if (iVar8 == 0) {
              uVar18 = (uVar18 << (bVar15 & 0x1f)) - uVar18 << (bVar14 & 0x1f);
            }
            else {
              uVar18 = (uVar18 << (bVar15 & 0x1f) | uVar18 >> 0x20 - (bVar15 & 0x1f)) - uVar18;
              uVar18 = uVar18 << (bVar14 & 0x1f) | uVar18 >> 0x20 - (bVar14 & 0x1f);
            }
            uVar29 = (ulong)uVar18 % (ulong)uVar7;
            if (*(int *)((long)&((dasm_State *)(__s->sections + -2))->psize + uVar29 * 4) == -1) {
              puVar22 = (uint *)((long)&((dasm_State *)(__s->sections + -2))->psize + uVar29 * 4);
            }
            else {
              uVar24 = (uint)uVar29;
              puVar22 = (uint *)((long)__s->sections + uVar29 * 4 + -0x4c);
              uVar18 = *puVar22;
              if (uVar18 != 0xffffffff) {
                if (uVar7 - 1 <= uVar24) {
                  return;
                }
                if (*(int *)((long)__s->sections + (long)(int)uVar24 * 4 + -0x48) != -1) {
                  return;
                }
                uVar17 = uVar18 & 0xffffff;
                if (iVar8 == 0) {
                  uVar17 = (uVar17 << (bVar15 & 0x1f)) - uVar17 << (bVar14 & 0x1f);
                }
                else {
                  uVar17 = (uVar17 << (bVar15 & 0x1f) | uVar17 >> 0x20 - (bVar15 & 0x1f)) - uVar17;
                  uVar17 = uVar17 << (bVar14 & 0x1f) | uVar17 >> 0x20 - (bVar14 & 0x1f);
                }
                if (uVar17 % uVar7 != uVar24 + 1) {
                  return;
                }
                *(uint *)((long)__s->sections + (long)(int)uVar24 * 4 + -0x48) = uVar18;
              }
            }
            *puVar22 = uVar26;
            lVar25 = lVar25 + 4;
          } while (uVar12 << 2 != lVar25);
        }
      }
      return;
    }
  }
  return;
}

Assistant:

static void libdef_name(const char *p, int kind)
{
  size_t n = strlen(p);
  if (kind != LIBINIT_STRING) {
    if (n > modnamelen && p[modnamelen] == '_' &&
	!strncmp(p, modname, modnamelen)) {
      p += modnamelen+1;
      n -= modnamelen+1;
    }
  }
  if (n > LIBINIT_MAXSTR) {
    fprintf(stderr, "Error: string too long: '%s'\n",  p);
    exit(1);
  }
  if (optr+1+n+2 > obuf+sizeof(obuf)) {  /* +2 for caller. */
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  *optr++ = (uint8_t)(n | kind);
  memcpy(optr, p, n);
  optr += n;
}